

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStruct_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts)

{
  SymbolTable<flatbuffers::Value> *this_00;
  BaseType BVar1;
  FieldDef *pFVar2;
  EnumDef *pEVar3;
  Type type;
  __type _Var4;
  Value *pVVar5;
  pointer ppFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string camel_name;
  string utype_name;
  string type_name;
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  CSharpGenerator *local_140;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  IDLOptions *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  BaseType local_90;
  undefined4 uStack_8c;
  StructDef *pSStack_88;
  EnumDef *local_80;
  uint16_t uStack_78;
  undefined6 uStack_76;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_140 = this;
  local_f8 = opts;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"private",(allocator<char> *)&local_118);
  this_00 = &(struct_def->super_Definition).attributes;
  SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"csharp_partial",(allocator<char> *)&local_118);
  pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (pVVar5 != (Value *)0x0) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  GenTypeName_ObjectAPI(&local_b0,local_140,(string *)struct_def,local_f8);
  std::operator+(&local_118,"class ",&local_b0);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::append((char *)code_ptr);
  for (ppFVar6 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
    pFVar2 = *ppFVar6;
    if (((pFVar2->deprecated == false) && ((pFVar2->value).type.base_type != BASE_TYPE_UTYPE)) &&
       ((pFVar2->value).type.element != BASE_TYPE_UTYPE)) {
      pVVar5 = &pFVar2->value;
      GenTypeGet_ObjectAPI_abi_cxx11_(&local_118,local_140,pVVar5->type,local_f8);
      if (((pFVar2->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
         (pFVar2->presence == kOptional)) {
        std::__cxx11::string::append((char *)&local_118);
      }
      Name_abi_cxx11_(&local_160,local_140,pFVar2);
      _Var4 = std::operator==(&local_160,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              struct_def);
      if (_Var4) {
        std::__cxx11::string::append((char *)&local_160);
      }
      if (local_f8->cs_gen_json_serializer == true) {
        pEVar3 = (pFVar2->value).type.enum_def;
        if ((pEVar3 != (EnumDef *)0x0) && (pEVar3->is_union == true)) {
          NamespacedName_abi_cxx11_(&local_138,local_140,&pEVar3->super_Definition);
          std::operator+(&local_1a0,"  [Newtonsoft.Json.JsonProperty(\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2
                        );
          std::operator+(&local_180,&local_1a0,"_type\")]\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          BVar1 = (pVVar5->type).base_type;
          if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
            std::operator+(&local_d0,"  private ",&local_138);
            std::operator+(&local_f0,&local_d0,"[] ");
            std::operator+(&local_1a0,&local_f0,&local_160);
            std::operator+(&local_180,&local_1a0,"Type {\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::append((char *)code_ptr);
            std::operator+(&local_1a0,"      if (this.",&local_160);
            std::operator+(&local_180,&local_1a0," == null) return null;\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::operator+(&local_d0,"      var _o = new ",&local_138);
            std::operator+(&local_f0,&local_d0,"[this.");
            std::operator+(&local_1a0,&local_f0,&local_160);
            std::operator+(&local_180,&local_1a0,".Count];\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::operator+(&local_1a0,
                           "      for (var _j = 0; _j < _o.Length; ++_j) { _o[_j] = this.",
                           &local_160);
            std::operator+(&local_180,&local_1a0,"[_j].Type; }\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::append((char *)code_ptr);
            std::__cxx11::string::append((char *)code_ptr);
            std::__cxx11::string::append((char *)code_ptr);
            std::operator+(&local_d0,"      this.",&local_160);
            std::operator+(&local_f0,&local_d0," = new List<");
            std::operator+(&local_1a0,&local_f0,&local_138);
            std::operator+(&local_180,&local_1a0,"Union>();\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::append((char *)code_ptr);
            std::operator+(&local_1a0,"        var _o = new ",&local_138);
            std::operator+(&local_180,&local_1a0,"Union();\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::append((char *)code_ptr);
            std::operator+(&local_1a0,"        this.",&local_160);
            std::operator+(&local_180,&local_1a0,".Add(_o);\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::append((char *)code_ptr);
          }
          else {
            std::operator+(&local_d0,"  private ",&local_138);
            std::operator+(&local_f0,&local_d0," ");
            std::operator+(&local_1a0,&local_f0,&local_160);
            std::operator+(&local_180,&local_1a0,"Type {\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::append((char *)code_ptr);
            std::operator+(&local_70,"      return this.",&local_160);
            std::operator+(&local_50,&local_70," != null ? this.");
            std::operator+(&local_d0,&local_50,&local_160);
            std::operator+(&local_f0,&local_d0,".Type : ");
            std::operator+(&local_1a0,&local_f0,&local_138);
            std::operator+(&local_180,&local_1a0,".NONE;\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::append((char *)code_ptr);
            std::__cxx11::string::append((char *)code_ptr);
            std::operator+(&local_d0,"      this.",&local_160);
            std::operator+(&local_f0,&local_d0," = new ");
            std::operator+(&local_1a0,&local_f0,&local_138);
            std::operator+(&local_180,&local_1a0,"Union();\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::operator+(&local_1a0,"      this.",&local_160);
            std::operator+(&local_180,&local_1a0,".Type = value;\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
          }
          std::__cxx11::string::append((char *)code_ptr);
          std::__cxx11::string::append((char *)code_ptr);
          std::__cxx11::string::~string((string *)&local_138);
        }
        std::operator+(&local_180,"  [Newtonsoft.Json.JsonProperty(\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar2);
        std::operator+(&local_138,&local_180,"\")]\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_180);
        pEVar3 = (pFVar2->value).type.enum_def;
        if ((pEVar3 != (EnumDef *)0x0) && (pEVar3->is_union == true)) {
          BVar1 = (pVVar5->type).base_type;
          if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
            local_90 = (pFVar2->value).type.element;
            pSStack_88 = (pFVar2->value).type.struct_def;
            uStack_78 = (pFVar2->value).type.fixed_length;
            uStack_8c = 0;
            type.element = BASE_TYPE_NONE;
            type.base_type = local_90;
            type._26_6_ = uStack_76;
            type.fixed_length = uStack_78;
            type.struct_def = pSStack_88;
            type.enum_def = pEVar3;
            local_80 = pEVar3;
            GenTypeGet_ObjectAPI_abi_cxx11_(&local_138,local_140,type,local_f8);
          }
          else {
            std::__cxx11::string::string((string *)&local_138,(string *)&local_118);
          }
          std::operator+(&local_1a0,"  [Newtonsoft.Json.JsonConverter(typeof(",&local_138);
          std::operator+(&local_180,&local_1a0,"_JsonConverter))]\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_138);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"hash",(allocator<char> *)&local_180);
        pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                           (&(pFVar2->super_Definition).attributes,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        if (pVVar5 != (Value *)0x0) {
          std::__cxx11::string::append((char *)code_ptr);
        }
      }
      std::operator+(&local_f0,"  public ",&local_118);
      std::operator+(&local_1a0,&local_f0," ");
      std::operator+(&local_180,&local_1a0,&local_160);
      std::operator+(&local_138,&local_180," { get; set; }\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_160,"  public ",&local_b0);
  std::operator+(&local_118,&local_160,"() {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_160);
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar6 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)code_ptr);
      if ((local_f8->cs_gen_json_serializer == true) &&
         (((local_140->super_BaseGenerator).parser_)->root_struct_def_ == struct_def)) {
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_160,"  public static ",&local_b0);
        std::operator+(&local_118,&local_160," DeserializeFromJson(string jsonText) {\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::operator+(&local_160,"    return Newtonsoft.Json.JsonConvert.DeserializeObject<",
                       &local_b0);
        std::operator+(&local_118,&local_160,">(jsonText);\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
      }
      if (((local_140->super_BaseGenerator).parser_)->root_struct_def_ == struct_def) {
        std::operator+(&local_160,"  public static ",&local_b0);
        std::operator+(&local_118,&local_160," DeserializeFromBinary(byte[] fbBuffer) {\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::operator+(&local_180,"    return ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::operator+(&local_138,&local_180,".GetRootAs");
        std::operator+(&local_160,&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::operator+(&local_118,&local_160,"(new ByteBuffer(fbBuffer)).UnPack();\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_f0,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::operator+(&local_1a0,&local_f0,".Finish");
        std::operator+(&local_180,&local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::operator+(&local_138,&local_180,"Buffer(fbb, ");
        std::operator+(&local_160,&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::operator+(&local_118,&local_160,".Pack(fbb, this));\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
      }
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::~string((string *)&local_b0);
      return;
    }
    pFVar2 = *ppFVar6;
    if (((pFVar2->deprecated == false) && ((pFVar2->value).type.base_type != BASE_TYPE_UTYPE)) &&
       ((pFVar2->value).type.element != BASE_TYPE_UTYPE)) {
      Name_abi_cxx11_(&local_118,local_140,pFVar2);
      _Var4 = std::operator==(&local_118,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              struct_def);
      if (_Var4) {
        std::__cxx11::string::append((char *)&local_118);
      }
      std::operator+(&local_138,"    this.",&local_118);
      std::operator+(&local_160,&local_138," = ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_138);
      GenTypeGet_ObjectAPI_abi_cxx11_(&local_160,local_140,(pFVar2->value).type,local_f8);
      BVar1 = (pFVar2->value).type.base_type;
      if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
        GenDefaultValue_abi_cxx11_(&local_180,local_140,pFVar2);
        std::operator+(&local_138,&local_180,";\n");
        std::__cxx11::string::append((string *)code_ptr);
LAB_0017f27a:
        std::__cxx11::string::~string((string *)&local_138);
        this_01 = &local_180;
LAB_0017f3b9:
        std::__cxx11::string::~string((string *)this_01);
      }
      else {
        if (BVar1 == BASE_TYPE_ARRAY) {
          std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_160);
          std::operator+(&local_1a0,"new ",&local_f0);
          NumToString<unsigned_short>(&local_d0,(pFVar2->value).type.fixed_length);
          std::operator+(&local_180,&local_1a0,&local_d0);
          std::operator+(&local_138,&local_180,"];\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_1a0);
          this_01 = &local_f0;
          goto LAB_0017f3b9;
        }
        if ((BVar1 == BASE_TYPE_STRUCT) && (((pFVar2->value).type.struct_def)->fixed == true)) {
          std::operator+(&local_180,"new ",&local_160);
          std::operator+(&local_138,&local_180,"();\n");
          std::__cxx11::string::append((string *)code_ptr);
          goto LAB_0017f27a;
        }
        std::__cxx11::string::append((char *)code_ptr);
      }
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_118);
    }
    ppFVar6 = ppFVar6 + 1;
  } while( true );
}

Assistant:

void GenStruct_ObjectAPI(StructDef &struct_def, std::string *code_ptr,
                           const IDLOptions &opts) const {
    auto &code = *code_ptr;
    if (struct_def.attributes.Lookup("private")) {
      code += "internal ";
    } else {
      code += "public ";
    }
    if (struct_def.attributes.Lookup("csharp_partial")) {
      // generate a partial class for this C# struct/table
      code += "partial ";
    }
    auto class_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    code += "class " + class_name;
    code += "\n{\n";
    // Generate Properties
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.value.type.base_type == BASE_TYPE_UTYPE) continue;
      if (field.value.type.element == BASE_TYPE_UTYPE) continue;
      auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
      if (field.IsScalarOptional()) type_name += "?";
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      if (opts.cs_gen_json_serializer) {
        if (IsUnion(field.value.type)) {
          auto utype_name = NamespacedName(*field.value.type.enum_def);
          code +=
              "  [Newtonsoft.Json.JsonProperty(\"" + field.name + "_type\")]\n";
          if (IsVector(field.value.type)) {
            code += "  private " + utype_name + "[] " + camel_name + "Type {\n";
            code += "    get {\n";
            code += "      if (this." + camel_name + " == null) return null;\n";
            code += "      var _o = new " + utype_name + "[this." + camel_name +
                    ".Count];\n";
            code +=
                "      for (var _j = 0; _j < _o.Length; ++_j) { _o[_j] = "
                "this." +
                camel_name + "[_j].Type; }\n";
            code += "      return _o;\n";
            code += "    }\n";
            code += "    set {\n";
            code += "      this." + camel_name + " = new List<" + utype_name +
                    "Union>();\n";
            code += "      for (var _j = 0; _j < value.Length; ++_j) {\n";
            code += "        var _o = new " + utype_name + "Union();\n";
            code += "        _o.Type = value[_j];\n";
            code += "        this." + camel_name + ".Add(_o);\n";
            code += "      }\n";
            code += "    }\n";
            code += "  }\n";
          } else {
            code += "  private " + utype_name + " " + camel_name + "Type {\n";
            code += "    get {\n";
            code += "      return this." + camel_name + " != null ? this." +
                    camel_name + ".Type : " + utype_name + ".NONE;\n";
            code += "    }\n";
            code += "    set {\n";
            code += "      this." + camel_name + " = new " + utype_name +
                    "Union();\n";
            code += "      this." + camel_name + ".Type = value;\n";
            code += "    }\n";
            code += "  }\n";
          }
        }
        code += "  [Newtonsoft.Json.JsonProperty(\"" + field.name + "\")]\n";
        if (IsUnion(field.value.type)) {
          auto union_name =
              (IsVector(field.value.type))
                  ? GenTypeGet_ObjectAPI(field.value.type.VectorType(), opts)
                  : type_name;
          code += "  [Newtonsoft.Json.JsonConverter(typeof(" + union_name +
                  "_JsonConverter))]\n";
        }
        if (field.attributes.Lookup("hash")) {
          code += "  [Newtonsoft.Json.JsonIgnore()]\n";
        }
      }
      code += "  public " + type_name + " " + camel_name + " { get; set; }\n";
    }
    // Generate Constructor
    code += "\n";
    code += "  public " + class_name + "() {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.value.type.base_type == BASE_TYPE_UTYPE) continue;
      if (field.value.type.element == BASE_TYPE_UTYPE) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      code += "    this." + camel_name + " = ";
      auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
      if (IsScalar(field.value.type.base_type)) {
        code += GenDefaultValue(field) + ";\n";
      } else {
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (IsStruct(field.value.type)) {
              code += "new " + type_name + "();\n";
            } else {
              code += "null;\n";
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            code += "new " + type_name.substr(0, type_name.length() - 1) +
                    NumToString(field.value.type.fixed_length) + "];\n";
            break;
          }
          default: {
            code += "null;\n";
            break;
          }
        }
      }
    }
    code += "  }\n";
    // Generate Serialization
    if (opts.cs_gen_json_serializer &&
        parser_.root_struct_def_ == &struct_def) {
      code += "\n";
      code += "  public static " + class_name +
              " DeserializeFromJson(string jsonText) {\n";
      code += "    return Newtonsoft.Json.JsonConvert.DeserializeObject<" +
              class_name + ">(jsonText);\n";
      code += "  }\n";
      code += "  public string SerializeToJson() {\n";
      code +=
          "    return Newtonsoft.Json.JsonConvert.SerializeObject(this, "
          "Newtonsoft.Json.Formatting.Indented);\n";
      code += "  }\n";
    }
    if (parser_.root_struct_def_ == &struct_def) {
      code += "  public static " + class_name +
              " DeserializeFromBinary(byte[] fbBuffer) {\n";
      code += "    return " + struct_def.name + ".GetRootAs" + struct_def.name +
              "(new ByteBuffer(fbBuffer)).UnPack();\n";
      code += "  }\n";
      code += "  public byte[] SerializeToBinary() {\n";
      code += "    var fbb = new FlatBufferBuilder(0x10000);\n";
      code += "    " + struct_def.name + ".Finish" + struct_def.name +
              "Buffer(fbb, " + struct_def.name + ".Pack(fbb, this));\n";
      code += "    return fbb.DataBuffer.ToSizedArray();\n";
      code += "  }\n";
    }
    code += "}\n\n";
  }